

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetVideoFrame
          (VClient *this,string *i_rCameraName,VVideoFramePtr *o_rVideoFramePtr)

{
  Enum EVar1;
  bool bVar2;
  VCameraInfo *pVVar3;
  VCameraInfo *pCamera;
  Enum local_3c;
  undefined1 local_38 [4];
  Enum GetResult;
  scoped_lock Lock;
  VVideoFramePtr *o_rVideoFramePtr_local;
  string *i_rCameraName_local;
  VClient *this_local;
  
  Lock._8_8_ = o_rVideoFramePtr;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_38,&this->m_FrameMutex);
  local_3c = Success;
  bVar2 = InitGet(this,&local_3c);
  if ((bVar2) && (pVVar3 = GetCamera(this,i_rCameraName,&local_3c), pVVar3 != (VCameraInfo *)0x0)) {
    GetVideoFrame(this,pVVar3->m_CameraID,&local_3c,(VVideoFramePtr *)Lock._8_8_);
  }
  EVar1 = local_3c;
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_38);
  return EVar1;
}

Assistant:

Result::Enum VClient::GetVideoFrame( const std::string & i_rCameraName, ViconCGStreamClientSDK::VVideoFramePtr & o_rVideoFramePtr ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Result::Enum GetResult = Result::Success;
  if ( InitGet( GetResult ) )
  {
    const ViconCGStream::VCameraInfo* pCamera = GetCamera( i_rCameraName, GetResult );
    if( !pCamera )
    {
      return GetResult;
    }

    GetVideoFrame( pCamera->m_CameraID, GetResult, o_rVideoFramePtr );
  }

  return GetResult;
}